

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

ssize __thiscall Socket::sendTo(Socket *this,byte *data,usize size,uint32 ip,uint16 port)

{
  ssize_t sVar1;
  int *piVar2;
  sockaddr local_18;
  
  local_18.sa_data[6] = '\0';
  local_18.sa_data[7] = '\0';
  local_18.sa_data[8] = '\0';
  local_18.sa_data[9] = '\0';
  local_18.sa_data[10] = '\0';
  local_18.sa_data[0xb] = '\0';
  local_18.sa_data[0xc] = '\0';
  local_18.sa_data[0xd] = '\0';
  local_18.sa_family = 2;
  local_18.sa_data._0_2_ = port << 8 | port >> 8;
  local_18.sa_data._2_4_ = ip >> 0x18 | (ip & 0xff0000) >> 8 | (ip & 0xff00) << 8 | ip << 0x18;
  sVar1 = sendto(this->s,data,(long)(int)size,0,&local_18,0x10);
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      *piVar2 = 0;
    }
  }
  return sVar1;
}

Assistant:

ssize Socket::sendTo(const byte* data, usize size, uint32 ip, uint16 port)
{
  struct sockaddr_in sin;
  memset(&sin, 0, sizeof(sin));
  sin.sin_family = AF_INET;
  sin.sin_port = htons(port);
  sin.sin_addr.s_addr = htonl(ip);

  ssize r = ::sendto(s, (const char*)data, (int)size, 0, (sockaddr*)&sin, sizeof(sin));
  if(r == SOCKET_ERROR)
  {
    if(ERRNO == EWOULDBLOCK 
#ifndef _WIN32
      || ERRNO == EAGAIN
#endif
      )
    {
      SET_ERRNO(0);
    }
    return -1;
  }
  return r;
}